

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O3

void keyboard_controls_proc(Am_Object *cmd)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  short *psVar7;
  Am_Value *pAVar8;
  Am_Object *pAVar9;
  ulong uVar10;
  undefined8 uVar11;
  Am_Object inter;
  Am_Input_Char c;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  undefined2 local_c;
  ushort local_a;
  
  Am_Object::Get_Object((ushort)&local_18,(ulong)cmd);
  psVar7 = (short *)Am_Object::Get((ushort)&local_18,0x11b);
  lVar1 = *(long *)(psVar7 + 4);
  if ((lVar1 != 0) && (*psVar7 != (short)Am_Input_Char::Am_Input_Char_ID)) {
    uVar11 = Am_Error();
    Am_Object::~Am_Object(&local_20);
    Am_Object::~Am_Object(&local_28);
    Am_Object::~Am_Object(&local_30);
    Am_Object::~Am_Object(&local_18);
    _Unwind_Resume(uVar11);
  }
  local_c = (undefined2)lVar1;
  local_a = (ushort)((ulong)lVar1 >> 0x10) & 0xfff;
  cVar2 = Am_Input_Char::As_Char();
  switch(cVar2) {
  case 'i':
switchD_00103f7f_caseD_69:
    if (num_bullets < 2) {
      pAVar8 = (Am_Value *)Am_Object::Get(0x82d8,0x69);
      bVar3 = Am_Value::operator_cast_to_bool(pAVar8);
      if (bVar3) {
        Am_Object::Get_Object((ushort)&local_30,0x1082d8);
        Am_Object::Create((char *)&local_28);
        pAVar8 = (Am_Value *)Am_Object::Get(0x82d8,100);
        iVar5 = Am_Value::operator_cast_to_int(pAVar8);
        pAVar8 = (Am_Value *)Am_Object::Get(0x82d8,0x66);
        iVar6 = Am_Value::operator_cast_to_int(pAVar8);
        uVar4 = Am_Object::Set((ushort)&local_28,100,(ulong)(uint)(iVar6 / 2 + iVar5));
        pAVar8 = (Am_Value *)Am_Object::Get(0x82e0,0x67);
        iVar5 = Am_Value::operator_cast_to_int(pAVar8);
        pAVar9 = (Am_Object *)Am_Object::Set(uVar4,0x65,(ulong)(uint)-iVar5);
        Am_Object::Am_Object(&local_20,pAVar9);
        Am_Object::Add_Part((Am_Object_Data *)&local_30,SUB81(&local_20,0),1);
        Am_Object::~Am_Object(&local_20);
        Am_Object::~Am_Object(&local_28);
        Am_Object::~Am_Object(&local_30);
        num_bullets = num_bullets + 1;
      }
    }
    break;
  case 'j':
    Am_Object::Set(0x82d8,100,10);
    break;
  case 'k':
  case 'm':
  case 'n':
  case 'o':
  case 'p':
switchD_00103f7f_caseD_6b:
    uVar10 = Am_Object::Get(0x82d8,100);
    Am_Object::Set(0x82d8,(Am_Value *)0x64,uVar10);
    break;
  case 'l':
    Am_Object::Get_Object((ushort)&local_30,0x1082d8);
    pAVar8 = (Am_Value *)Am_Object::Get((ushort)&local_30,0x66);
    iVar5 = Am_Value::operator_cast_to_int(pAVar8);
    pAVar8 = (Am_Value *)Am_Object::Get(0x82d8,0x66);
    iVar6 = Am_Value::operator_cast_to_int(pAVar8);
    Am_Object::Set(0x82d8,100,(ulong)((iVar5 - iVar6) - 10));
    Am_Object::~Am_Object(&local_30);
    break;
  case 'q':
    Am_Exit_Main_Event_Loop();
    break;
  default:
    if (cVar2 == ' ') goto switchD_00103f7f_caseD_69;
    if (cVar2 != '?') goto switchD_00103f7f_caseD_6b;
  case 'h':
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"q = quit\n",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"p = pause (wait forever)\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"j = move left\n",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"l = move right\n",0xf)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"i or space = shoot\n",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    std::ostream::flush();
  }
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, keyboard_controls, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);
  switch (c.As_Char()) {
  case 'p': {
    int i = 0;
    while (true) { //pause, wait forever
      i++;
    }
  }
  case 'j': // left
    Ship.Set(Am_LEFT, 10);
    break;
  case 'l': // right
    Ship.Set(Am_LEFT, (int)Ship.Get_Owner().Get(Am_WIDTH) -
                          (int)Ship.Get(Am_WIDTH) - 10);
    break;
  case ' ':
  case 'i': // shoot
    if (num_bullets < MAX_BULLETS && (bool)Ship.Get(Am_VISIBLE)) {
      Ship.Get_Owner().Add_Part(
          Bullet.Create()
              .Set(Am_LEFT,
                   (int)Ship.Get(Am_LEFT) + ((int)Ship.Get(Am_WIDTH) / 2))
              .Set(Am_TOP, -(int)Bullet.Get(Am_HEIGHT)));
      num_bullets++;
    }
    break;
  case 'q':
    Am_Exit_Main_Event_Loop();
    break;
  case '?':
  case 'h':
    cout << "q = quit\n"
         << "p = pause (wait forever)\n"
         << "j = move left\n"
         << "l = move right\n"
         << "i or space = shoot\n"
         << endl
         << flush;
    break;
  default: // stop
    // stop the ship where it is
    Ship.Set(Am_LEFT, Ship.Get(Am_LEFT));
  }
}